

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O2

void project_feature_handler_MAKE_DOOR(project_feature_handler_context_t *context)

{
  uint32_t *puVar1;
  loc grid;
  _Bool _Var2;
  monster *pmVar3;
  loc grid_00;
  object *poVar4;
  uint uVar5;
  long lVar6;
  
  grid = context->grid;
  pmVar3 = square_monster(cave,grid);
  if (pmVar3 == (monster *)0x0) {
    _Var2 = square_isplayer(cave,grid);
    if (!_Var2) {
      _Var2 = square_isfloor(cave,grid);
      if (_Var2) {
        uVar5 = 0;
        for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 0x10) {
          grid_00 = (loc)loc_sum(player->grid,*(loc_conflict *)((long)&ddgrid_ddd[0].x + lVar6));
          _Var2 = square_isstrongwall(cave,grid_00);
          uVar5 = uVar5 + _Var2;
        }
        if (1 < uVar5) {
          poVar4 = square_object(cave,grid);
          if (poVar4 != (object *)0x0) {
            push_object(grid);
          }
          square_add_door(cave,grid,true);
          _Var2 = square_isseen(cave,grid);
          if (_Var2) {
            context->obvious = true;
          }
          puVar1 = &player->upkeep->update;
          *puVar1 = *puVar1 | 0xc0;
        }
      }
    }
  }
  return;
}

Assistant:

static void project_feature_handler_MAKE_DOOR(project_feature_handler_context_t *context)
{
	const struct loc grid = context->grid;
	int d, count = 0;

	/* Require a grid without monsters */
	if (square_monster(cave, grid) || square_isplayer(cave, grid)) return;

	/* Require a floor grid */
	if (!square_isfloor(cave, grid)) return;

	/* Require at least two walls in cardinal directions */
	for (d = 0; d < 4; d++) {
		struct loc grid1 = loc_sum(player->grid, ddgrid_ddd[2 * d]);
		if (square_isstrongwall(cave, grid1)) count++;
	}
	if (count < 2) return;

	/* Push objects off the grid */
	if (square_object(cave, grid))
		push_object(grid);

	/* Create closed door */
	square_add_door(cave, grid, true);

	/* Observe */
	if (square_isseen(cave, grid))
		context->obvious = true;

	/* Update the visuals */
	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
}